

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O2

void ReadToString(string *filename,string *s)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  pointer __s;
  undefined1 *local_1ff8 [2];
  undefined1 local_1fe8 [16];
  char buffer [8092];
  
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    __s = (filename->_M_dataplus)._M_p;
  }
  else {
    while( true ) {
      sVar2 = fread(buffer,1,0x1f9c,__stream);
      if (sVar2 == 0) {
        fclose(__stream);
        return;
      }
      iVar1 = ferror(__stream);
      if (iVar1 != 0) break;
      local_1ff8[0] = local_1fe8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1ff8,buffer,buffer + sVar2);
      std::__cxx11::string::append((string *)s);
      std::__cxx11::string::~string((string *)local_1ff8);
    }
    __s = (filename->_M_dataplus)._M_p;
  }
  perror(__s);
  exit(1);
}

Assistant:

static void ReadToString(const string& filename, string* s) {
  const int bufsize = 8092;
  char buffer[bufsize];
  size_t n;
  FILE* fp = fopen(filename.c_str(), "rb");
  if (!fp)  PFATAL(filename.c_str());
  while ((n=fread(buffer, 1, bufsize, fp)) > 0) {
    if (ferror(fp))  PFATAL(filename.c_str());
    s->append(string(buffer, n));
  }
  fclose(fp);
}